

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.cpp
# Opt level: O1

void __thiscall
StringifyTest_DedupeSubstrings_Test::TestBody(StringifyTest_DedupeSubstrings_Test *this)

{
  pointer *ppuVar1;
  void *pvVar2;
  long lVar3;
  char *message;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<wasm::SuffixTree::RepeatedSubstring> __l_01;
  undefined1 local_4d8 [8];
  Module wasm;
  uint local_e0 [2];
  undefined1 local_d8 [8];
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  substrings;
  Substrings result;
  vector<unsigned_int,_std::allocator<unsigned_int>_> hashString;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  undefined4 local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  local_50;
  internal local_38 [8];
  AssertionResult gtest_ar;
  
  ::wasm::Module::Module((Module *)local_4d8);
  ppuVar1 = &local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  hashString.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &hashString.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             "\n    (module\n      (func $a\n        (block $block_a\n          (drop (i32.const 20))\n          (drop (i32.const 10))\n        )\n        (block $block_b\n          (drop (if (result i32)\n            (i32.const 0)\n            (then (i32.const 40))\n            (else (i32.const 5))\n          ))\n        )\n        (block $block_c\n          (drop (if (result i32)\n            (i32.const 1)\n            (then (i32.const 30))\n          ))\n        )\n        (block $block_d\n          (drop (i32.const 20))\n          (drop (i32.const 10))\n        )\n        (block $block_e\n          (drop (if (result i32)\n            (i32.const 1)\n            (then (i32.const 30))\n          ))\n        )\n        (block $block_f\n          (drop (if (result i32)\n            (i32.const 0)\n            (then (i32.const 30))\n          ))\n        )\n      )\n    )\n  "
             ,"");
  PrintTest::parseWast
            (&this->super_StringifyTest,(Module *)local_4d8,
             (string *)
             &hashString.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if ((pointer *)
      hashString.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != ppuVar1) {
    operator_delete(hashString.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish + 1);
  }
  hashStringifyModule((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      &result.
                       super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(Module *)local_4d8);
  ::wasm::StringifyProcessor::repeatSubstrings((vector *)local_d8);
  ::wasm::StringifyProcessor::dedupe
            ((vector *)
             &substrings.
              super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  hashString.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(hashString.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,4);
  wasm.tagsMap._M_h._M_single_bucket = (__node_base_ptr)0x1c0000000c;
  __l._M_len = 2;
  __l._M_array = (iterator)&wasm.tagsMap._M_h._M_single_bucket;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_88,__l,
             (allocator_type *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 5));
  local_70 = 3;
  local_e0[0] = 0x17;
  local_e0[1] = 0x22;
  __l_00._M_len = 2;
  __l_00._M_array = local_e0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_68,__l_00,
             (allocator_type *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 6));
  __l_01._M_len = 2;
  __l_01._M_array =
       (iterator)
       &hashString.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  std::
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ::vector(&local_50,__l_01,
           (allocator_type *)
           ((long)&gtest_ar.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7));
  testing::internal::
  CmpHelperEQ<std::vector<wasm::SuffixTree::RepeatedSubstring,std::allocator<wasm::SuffixTree::RepeatedSubstring>>,std::vector<wasm::SuffixTree::RepeatedSubstring,std::allocator<wasm::SuffixTree::RepeatedSubstring>>>
            (local_38,"result",
             "(std::vector<SuffixTree::RepeatedSubstring>{ SuffixTree::RepeatedSubstring{4u, (std::vector<unsigned>{12, 28})}, SuffixTree::RepeatedSubstring{3u, (std::vector<unsigned>{23, 34})}})"
             ,(vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
               *)&substrings.
                  super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_50);
  std::
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ::~vector(&local_50);
  lVar3 = 0x40;
  do {
    pvVar2 = *(void **)((long)&result.
                               super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar3);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)&hashString.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_finish + lVar3) -
                             (long)pvVar2);
    }
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != 0);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message
              ((Message *)
               &hashString.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/stringify.cpp"
               ,0x132,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_50,
               (Message *)
               &hashString.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if (hashString.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      (**(code **)(*(long *)hashString.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  std::
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ::~vector((vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
             *)&substrings.
                super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ::~vector((vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
             *)local_d8);
  if (result.
      super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(result.
                    super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (long)hashString.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)result.
                          super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  ::wasm::Module::~Module((Module *)local_4d8);
  return;
}

Assistant:

TEST_F(StringifyTest, DedupeSubstrings) {
  Module wasm;
  parseWast(wasm, dupModuleText);
  auto hashString = hashStringifyModule(&wasm);
  std::vector<SuffixTree::RepeatedSubstring> substrings =
    StringifyProcessor::repeatSubstrings(hashString);
  auto result = StringifyProcessor::dedupe(substrings);

  EXPECT_EQ(
    result,
    (std::vector<SuffixTree::RepeatedSubstring>{
      // 5, 6, 7, 6 appears at idx 12 and again at 28
      SuffixTree::RepeatedSubstring{4u, (std::vector<unsigned>{12, 28})},
      // 10, 11, 6 appears at idx 23 and again at 34
      SuffixTree::RepeatedSubstring{3u, (std::vector<unsigned>{23, 34})}}));
}